

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::RepeatedField
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  long *plVar1;
  RepeatedField<long> *in_RSI;
  long *in_RDI;
  int in_stack_0000005c;
  RepeatedField<long> *in_stack_00000060;
  int in_stack_0000008c;
  RepeatedField<long> *in_stack_00000090;
  int in_stack_000000ec;
  RepeatedField<long> *in_stack_000000f0;
  int array_size;
  
  *(undefined4 *)in_RDI = 0;
  *(undefined4 *)((long)in_RDI + 4) = 0;
  in_RDI[1] = 0;
  if (in_RSI->current_size_ != 0) {
    size(in_RSI);
    Reserve(in_stack_000000f0,in_stack_000000ec);
    size(in_RSI);
    AddNAlreadyReserved(in_stack_00000060,in_stack_0000005c);
    plVar1 = Mutable(in_stack_00000090,in_stack_0000008c);
    array_size = (int)((ulong)plVar1 >> 0x20);
    plVar1 = Get(in_stack_00000090,in_stack_0000008c);
    size(in_RSI);
    CopyArray(in_RSI,in_RDI,plVar1,array_size);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}